

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

htmlDocPtr htmlSAXParseDoc(xmlChar *cur,char *encoding,htmlSAXHandlerPtr sax,void *userData)

{
  htmlParserCtxtPtr ctxt_00;
  htmlParserCtxtPtr ctxt;
  htmlDocPtr ret;
  void *userData_local;
  htmlSAXHandlerPtr sax_local;
  char *encoding_local;
  xmlChar *cur_local;
  
  if (cur == (xmlChar *)0x0) {
    cur_local = (xmlChar *)0x0;
  }
  else {
    ctxt_00 = htmlCreateDocParserCtxt(cur,(char *)0x0,encoding);
    if (ctxt_00 == (htmlParserCtxtPtr)0x0) {
      cur_local = (xmlChar *)0x0;
    }
    else {
      if (sax != (htmlSAXHandlerPtr)0x0) {
        memcpy(ctxt_00->sax,sax,0x100);
        ctxt_00->userData = userData;
      }
      htmlParseDocument(ctxt_00);
      cur_local = (xmlChar *)ctxt_00->myDoc;
      htmlFreeParserCtxt(ctxt_00);
    }
  }
  return (htmlDocPtr)cur_local;
}

Assistant:

htmlDocPtr
htmlSAXParseDoc(const xmlChar *cur, const char *encoding,
                htmlSAXHandlerPtr sax, void *userData) {
    htmlDocPtr ret;
    htmlParserCtxtPtr ctxt;

    if (cur == NULL)
        return(NULL);

    ctxt = htmlCreateDocParserCtxt(cur, NULL, encoding);
    if (ctxt == NULL)
        return(NULL);

    if (sax != NULL) {
        *ctxt->sax = *sax;
        ctxt->userData = userData;
    }

    htmlParseDocument(ctxt);
    ret = ctxt->myDoc;
    htmlFreeParserCtxt(ctxt);

    return(ret);
}